

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined3 uVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  ParamDict *this_00;
  undefined8 uVar9;
  long in_RDI;
  ParamDict pd;
  InnerProduct *innerproduct;
  Convolution *convolution;
  int j;
  int top_blob_index;
  Pooling *pooling;
  int i;
  int layer_count;
  Layer *in_stack_fffffffffffff9e8;
  value_type in_stack_fffffffffffff9f0;
  value_type pLVar10;
  FILE *__stream;
  ParamDict *in_stack_fffffffffffffa30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa88;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa90;
  int local_20;
  int local_10;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28));
  iVar5 = (int)sVar6;
  local_10 = 0;
  do {
    if (iVar5 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
               (long)local_10);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
    if ((!bVar4) &&
       (ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_10),
       *(int *)((long)&(*ppLVar7)[1].type.field_2 + 4) != 0)) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                           (long)local_10);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
      iVar1 = *pvVar8;
      local_20 = local_10;
      do {
        do {
          do {
            local_20 = local_20 + 1;
            if (iVar5 <= local_20) goto LAB_00119ab0;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                       (long)local_20);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8);
          } while (bVar4);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x28),(long)local_20);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
        } while (sVar6 != 1);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_20);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
      } while (*pvVar8 != iVar1);
LAB_00119ab0:
      if (local_20 != iVar5) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_20);
        pLVar10 = *ppLVar7;
        __stream = _stderr;
        this_00 = (ParamDict *)std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        fprintf(__stream,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",
                this_00,uVar9);
        in_stack_fffffffffffff9e8 = ncnn::create_layer((char *)in_stack_fffffffffffff9e8);
        std::__cxx11::string::operator=((string *)&in_stack_fffffffffffff9e8->type,"InnerProduct");
        std::__cxx11::string::operator=
                  ((string *)&in_stack_fffffffffffff9e8->name,(string *)&pLVar10->name);
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        ncnn::ParamDict::ParamDict(in_stack_fffffffffffffa30);
        (*in_stack_fffffffffffff9e8->_vptr_Layer[2])
                  (in_stack_fffffffffffff9e8,&stack0xfffffffffffffa30);
        *(undefined4 *)&in_stack_fffffffffffff9e8[1]._vptr_Layer =
             *(undefined4 *)&pLVar10[1]._vptr_Layer;
        *(undefined4 *)((long)&in_stack_fffffffffffff9e8[1]._vptr_Layer + 4) =
             *(undefined4 *)((long)&pLVar10[1].type.field_2 + 4);
        uVar2 = *(undefined4 *)((long)&pLVar10[1].type.field_2 + 8);
        in_stack_fffffffffffff9e8[1].one_blob_only = (bool)(char)uVar2;
        in_stack_fffffffffffff9e8[1].support_inplace = (bool)(char)((uint)uVar2 >> 8);
        in_stack_fffffffffffff9e8[1].support_vulkan = (bool)(char)((uint)uVar2 >> 0x10);
        in_stack_fffffffffffff9e8[1].field_0xb = (char)((uint)uVar2 >> 0x18);
        ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_fffffffffffff9f0);
        ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_fffffffffffff9f0);
        uVar3 = *(undefined3 *)&pLVar10[1].name.field_0x1;
        in_stack_fffffffffffff9e8[1].type._M_dataplus = pLVar10[1].name._M_dataplus;
        *(undefined3 *)&in_stack_fffffffffffff9e8[1].type.field_0x1 = uVar3;
        ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_fffffffffffff9f0);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_20);
        *ppLVar7 = in_stack_fffffffffffff9e8;
        in_stack_fffffffffffff9f0 = pLVar10;
        if (pLVar10 != (value_type)0x0) {
          (*pLVar10->_vptr_Layer[1])();
          in_stack_fffffffffffff9f0 = pLVar10;
        }
        ncnn::ParamDict::~ParamDict(this_00);
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}